

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall CheaterBotStrategy::cheaterReinforce(CheaterBotStrategy *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  reference ppCVar4;
  PlayerStrategy *pPVar5;
  string local_50;
  Country *local_30;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  CheaterBotStrategy *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "We have a cheater! They are doubling all armies on their countries");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_01 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(this_01);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    local_30 = *ppCVar4;
    poVar3 = std::operator<<((ostream *)&std::cout,"[CHEATER] - Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_50,local_30);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," had ");
    iVar2 = Map::Country::getNumberOfTroops(local_30);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," armies. It now has ");
    std::__cxx11::string::~string((string *)&local_50);
    iVar2 = Map::Country::getNumberOfTroops(local_30);
    if (0 < iVar2 * 2) {
      iVar2 = Map::Country::getNumberOfTroops(local_30);
      this_00 = local_30;
      if (iVar2 * 2 < 0x7fffffff) {
        iVar2 = Map::Country::getNumberOfTroops(local_30);
        Map::Country::setNumberOfTroops(this_00,iVar2 << 1);
      }
    }
    iVar2 = Map::Country::getNumberOfTroops(local_30);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    poVar3 = std::operator<<(poVar3," armies. -");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
  pPVar5 = Player::getStrategy((this->super_PlayerStrategy).player);
  (*pPVar5->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterReinforce() {
    std::cout << "We have a cheater! They are doubling all armies on their countries" << std::endl;

    for(auto* country : *this->player->getOwnedCountries()) {
        std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
        //prevent overflow
        if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
            country->setNumberOfTroops(country->getNumberOfTroops() * 2);
        }
        std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
    }

    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}